

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-type.h
# Opt level: O2

BasicHeapType __thiscall wasm::HeapType::getTop(HeapType *this)

{
  BasicHeapType BVar1;
  Shareability share;
  HeapType local_20;
  
  BVar1 = getUnsharedTop(this);
  local_20.id = (uintptr_t)BVar1;
  share = getShared(this);
  BVar1 = getBasic(&local_20,share);
  return BVar1;
}

Assistant:

BasicHeapType getTop() const {
    return HeapType(getUnsharedTop()).getBasic(getShared());
  }